

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  byte bVar1;
  uint8_t *puVar2;
  st_ptls_aead_algorithm_t *psVar3;
  ulong uVar4;
  st_ptls_aead_context_t *psVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  uint8_t *puVar11;
  long lVar12;
  size_t inlen;
  size_t sVar13;
  uint8_t *local_58;
  uint8_t aad [13];
  
  local_58 = src;
  if (len == 0) {
    iVar8 = 0;
  }
  else {
    do {
      inlen = 0x4000;
      if (len < 0x4000) {
        inlen = len;
      }
      bVar1 = enc->field_0x58;
      iVar8 = ptls_buffer_reserve_aligned(buf,3,'\0');
      if ((bVar1 & 1) == 0) {
        if (iVar8 == 0) {
          puVar2 = buf->base;
          sVar13 = buf->off;
          puVar11 = puVar2 + sVar13;
          puVar11[0] = '\x17';
          puVar11[1] = '\x03';
          puVar2[sVar13 + 2] = '\x03';
          buf->off = buf->off + 3;
          iVar8 = 0;
        }
        bVar6 = true;
        if (iVar8 == 0) {
          iVar8 = ptls_buffer_reserve_aligned(buf,2,'\0');
          if (iVar8 == 0) {
            puVar11 = buf->base;
            sVar13 = buf->off;
            (puVar11 + sVar13)[0] = '\0';
            (puVar11 + sVar13)[1] = '\0';
            buf->off = buf->off + 2;
            iVar8 = 0;
          }
          if (iVar8 == 0) {
            sVar13 = buf->off;
            psVar3 = enc->aead->algo;
            iVar8 = ptls_buffer_reserve_aligned(buf,inlen + psVar3->tag_size + 1,psVar3->align_bits)
            ;
            if (iVar8 != 0) goto LAB_00114b78;
            sVar9 = aead_encrypt(enc,buf->base + buf->off,local_58,inlen,type);
            sVar9 = sVar9 + buf->off;
            buf->off = sVar9;
            uVar10 = sVar9 - sVar13;
            if (0xffff < uVar10) goto LAB_00114b73;
            lVar12 = 8;
            do {
              buf->base[sVar13 - 2] = (uint8_t)(uVar10 >> ((byte)lVar12 & 0x3f));
              lVar12 = lVar12 + -8;
              sVar13 = sVar13 + 1;
            } while (lVar12 != -8);
LAB_00114bb9:
            bVar7 = true;
            iVar8 = 0;
            bVar6 = false;
          }
          else {
LAB_00114b78:
            bVar6 = true;
            bVar7 = false;
          }
          if (bVar7) {
            local_58 = local_58 + inlen;
            len = len - inlen;
            bVar6 = false;
          }
        }
      }
      else {
        if (iVar8 == 0) {
          puVar11 = buf->base;
          sVar13 = buf->off;
          puVar11[sVar13] = type;
          puVar11 = puVar11 + sVar13 + 1;
          puVar11[0] = '\x03';
          puVar11[1] = '\x03';
          buf->off = buf->off + 3;
          iVar8 = 0;
        }
        bVar6 = true;
        if (iVar8 == 0) {
          iVar8 = ptls_buffer_reserve_aligned(buf,2,'\0');
          if (iVar8 == 0) {
            puVar11 = buf->base;
            sVar13 = buf->off;
            (puVar11 + sVar13)[0] = '\0';
            (puVar11 + sVar13)[1] = '\0';
            buf->off = buf->off + 2;
            iVar8 = 0;
          }
          if (iVar8 == 0) {
            sVar13 = buf->off;
            psVar3 = enc->aead->algo;
            iVar8 = ptls_buffer_reserve_aligned
                              (buf,(psVar3->tls12).record_iv_size + inlen + psVar3->tag_size,
                               psVar3->align_bits);
            if (iVar8 == 0) {
              sVar9 = (enc->aead->algo->tls12).record_iv_size;
              if (sVar9 == 0) {
                uVar10 = enc->seq;
              }
              else {
                if (sVar9 != 8) {
                  __assert_fail("enc->aead->algo->tls12.record_iv_size == 8",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0x30b,
                                "int buffer_push_encrypted_records(ptls_buffer_t *, uint8_t, const uint8_t *, size_t, struct st_ptls_traffic_protection_t *)"
                               );
                }
                uVar10 = enc->tls12_enc_record_iv;
                enc->tls12_enc_record_iv = uVar10 + 1;
                puVar11 = buf->base + buf->off;
                lVar12 = 0x38;
                do {
                  *puVar11 = (uint8_t)(uVar10 >> ((byte)lVar12 & 0x3f));
                  lVar12 = lVar12 + -8;
                  puVar11 = puVar11 + 1;
                } while (lVar12 != -8);
                buf->off = buf->off + 8;
              }
              uVar4 = enc->seq;
              lVar12 = 0x38;
              puVar11 = aad;
              do {
                *puVar11 = (uint8_t)(uVar4 >> ((byte)lVar12 & 0x3f));
                lVar12 = lVar12 + -8;
                puVar11 = puVar11 + 1;
              } while (lVar12 != -8);
              aad[9] = '\x03';
              aad[10] = '\x03';
              aad[0xb] = (uint8_t)(inlen >> 8);
              aad[0xc] = (uint8_t)inlen;
              psVar5 = enc->aead;
              aad[8] = type;
              (*psVar5->do_encrypt)
                        (psVar5,buf->base + buf->off,local_58,inlen,uVar10,aad,0xd,
                         (ptls_aead_supplementary_encryption_t *)0x0);
              sVar9 = psVar5->algo->tag_size + inlen + buf->off;
              buf->off = sVar9;
              enc->seq = enc->seq + 1;
              uVar10 = sVar9 - sVar13;
              if (uVar10 < 0x10000) {
                lVar12 = 8;
                do {
                  buf->base[sVar13 - 2] = (uint8_t)(uVar10 >> ((byte)lVar12 & 0x3f));
                  lVar12 = lVar12 + -8;
                  sVar13 = sVar13 + 1;
                } while (lVar12 != -8);
                goto LAB_00114bb9;
              }
LAB_00114b73:
              iVar8 = 0x20c;
            }
          }
          goto LAB_00114b78;
        }
      }
    } while ((!bVar6) && (len != 0));
  }
  return iVar8;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        if (enc->tls12) {
            buffer_push_record(buf, type, {
                /* reserve memory */
                if ((ret = ptls_buffer_reserve_aligned(
                         buf, enc->aead->algo->tls12.record_iv_size + chunk_size + enc->aead->algo->tag_size,
                         enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                /* determine nonce, as well as prepending that walue as the record IV (AES-GCM) */
                uint64_t nonce;
                if (enc->aead->algo->tls12.record_iv_size != 0) {
                    assert(enc->aead->algo->tls12.record_iv_size == 8);
                    nonce = enc->tls12_enc_record_iv++;
                    encode64(buf->base + buf->off, nonce);
                    buf->off += 8;
                } else {
                    nonce = enc->seq;
                }
                /* build AAD */
                uint8_t aad[PTLS_TLS12_AAD_SIZE];
                build_tls12_aad(aad, type, enc->seq, (uint16_t)chunk_size);
                /* encrypt */
                buf->off += ptls_aead_encrypt(enc->aead, buf->base + buf->off, src, chunk_size, nonce, aad, sizeof(aad));
                ++enc->seq;
            });
        } else {
            buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
                if ((ret = ptls_buffer_reserve_aligned(buf, chunk_size + enc->aead->algo->tag_size + 1,
                                                       enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
            });
        }
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}